

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnRevSubClampPalCommand::Execute
          (DrawColumnRevSubClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  int core_skip;
  int iVar9;
  byte *pbVar10;
  int pass_skip;
  uint uVar11;
  int iVar12;
  uint uVar13;
  
  iVar9 = (this->super_PalColumnCommand).super_DrawerCommand._dest_y;
  iVar1 = *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc;
  iVar12 = thread->pass_end_y - iVar9;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  if (iVar1 < iVar12) {
    iVar12 = iVar1;
  }
  uVar11 = thread->pass_start_y - iVar9;
  if ((int)uVar11 < 1) {
    uVar11 = 0;
  }
  iVar1 = thread->num_cores;
  iVar9 = (iVar1 - (int)((iVar9 + uVar11) - thread->core) % iVar1) % iVar1;
  uVar7 = (long)(int)((~uVar11 + iVar1 + iVar12) - iVar9) / (long)iVar1;
  uVar8 = uVar7 & 0xffffffff;
  if (0 < (int)uVar7) {
    iVar12 = (this->super_PalColumnCommand)._pitch;
    iVar2 = (this->super_PalColumnCommand)._iscale;
    iVar9 = iVar9 + uVar11;
    pbVar10 = (this->super_PalColumnCommand)._dest + iVar12 * iVar9;
    iVar9 = iVar9 * iVar2 + (this->super_PalColumnCommand)._texturefrac;
    puVar3 = (this->super_PalColumnCommand)._colormap;
    puVar4 = (this->super_PalColumnCommand)._source;
    puVar5 = (this->super_PalColumnCommand)._srcblend;
    puVar6 = (this->super_PalColumnCommand)._destblend;
    do {
      uVar11 = (puVar6[*pbVar10] | 0x40100400) - puVar5[puVar3[puVar4[iVar9 >> 0x10]]];
      uVar13 = uVar11 & 0x40100400;
      uVar11 = uVar13 - (uVar13 >> 5) & uVar11 | 0x1f07c1f;
      *pbVar10 = RGB32k.All[uVar11 >> 0xf & uVar11];
      pbVar10 = pbVar10 + iVar12 * iVar1;
      iVar9 = iVar9 + iVar2 * iVar1;
      uVar11 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar11;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

void DrawColumnRevSubClampPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;
		fixed_t frac;
		fixed_t fracstep;

		count = _count;
		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		const uint8_t *colormap = _colormap;
		const uint8_t *source = _source;
		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		do
		{
			uint32_t a = (bg2rgb[*dest] | 0x40100400) - fg2rgb[colormap[source[frac >> FRACBITS]]];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[a & (a >> 15)];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}